

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Linear_Object_State_PDU::Encode(Linear_Object_State_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pLVar3;
  __normal_iterator<const_KDIS::DATA_TYPE::LinearSegmentParameter_*,_std::vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Linear_Object_State_PDU *this_local;
  
  Object_State_Header::Encode(&this->super_Object_State_Header,stream);
  pKVar2 = KDataStream::operator<<(stream,(this->super_Object_State_Header).field_0x4b);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_ReqID).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_RecvID).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar2,&(this->m_ObjTyp).super_DataTypeBase);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
            ::begin(&this->m_vSegments);
  local_28._M_current =
       (LinearSegmentParameter *)
       std::
       vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
       ::end(&this->m_vSegments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pLVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::LinearSegmentParameter_*,_std::vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>_>
             ::operator->(&citrEnd);
    (*(pLVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pLVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::LinearSegmentParameter_*,_std::vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Linear_Object_State_PDU::Encode( KDataStream & stream ) const
{
    Object_State_Header::Encode( stream );

    stream << m_ui8NumSegment
           << KDIS_STREAM m_ReqID
           << KDIS_STREAM m_RecvID
           << KDIS_STREAM m_ObjTyp;

    vector<LinearSegmentParameter>::const_iterator citr = m_vSegments.begin();
    std::vector<LinearSegmentParameter>::const_iterator citrEnd = m_vSegments.end();
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}